

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O0

int lua_dump(lua_State *L,lua_Writer writer,void *data,int strip)

{
  TValue *o;
  int status;
  int strip_local;
  void *data_local;
  lua_Writer writer_local;
  lua_State *L_local;
  
  if (L->top[-1].tt_ == 0x46) {
    o._0_4_ = luaU_dump(L,*(Proto **)(L->top[-1].value_.f + 0x18),writer,data,strip);
  }
  else {
    o._0_4_ = 1;
  }
  return (int)o;
}

Assistant:

LUA_API int lua_dump(lua_State *L, lua_Writer writer, void *data, int strip) {
    int status;
    TValue *o;
    lua_lock(L);
    api_checknelems(L, 1);
    o = L->top - 1;
    if (isLfunction(o))
        status = luaU_dump(L, getproto(o), writer, data, strip);
    else
        status = 1;
    lua_unlock(L);
    return status;
}